

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::MatchCharNode::AnnotatePass1
          (MatchCharNode *this,Compiler *compiler,bool parentNotInLoop,bool parentAtLeastOnce,
          bool parentNotSpeculative,bool parentNotNegated)

{
  CharSet<char16_t> *this_00;
  int i;
  ulong uVar1;
  
  (this->super_Node).features = 0x20;
  (this->super_Node).thisConsumes.lower = 1;
  (this->super_Node).thisConsumes.upper = 1;
  this_00 = (CharSet<char16_t> *)new<Memory::ArenaAllocator>(0x28,compiler->ctAllocator,0x35916e);
  CharSet<char16_t>::CharSet(this_00);
  (this->super_Node).firstSet = this_00;
  for (uVar1 = 0; uVar1 < (ulong)this->isEquivClass * 3 + 1; uVar1 = uVar1 + 1) {
    CharSet<char16_t>::Set((this->super_Node).firstSet,compiler->ctAllocator,this->cs[uVar1]);
  }
  *(uint *)&(this->super_Node).field_0xc =
       (*(uint *)&(this->super_Node).field_0xc & 0xffffc3cc) +
       ((uint)parentNotInLoop << 10 | (uint)parentAtLeastOnce << 0xb |
        (uint)parentNotSpeculative << 0xc | (uint)parentNotNegated << 0xd) + 0x31;
  return;
}

Assistant:

void MatchCharNode::AnnotatePass1(Compiler& compiler, bool parentNotInLoop, bool parentAtLeastOnce, bool parentNotSpeculative, bool parentNotNegated)
    {
        features = HasMatchChar;
        thisConsumes.Exact(1);
        firstSet = Anew(compiler.ctAllocator, UnicodeCharSet);
        for (int i = 0; i < (isEquivClass ? CaseInsensitive::EquivClassSize : 1); i++)
            firstSet->Set(compiler.ctAllocator, cs[i]);
        isFirstExact = true;
        isThisIrrefutable = false;
        isThisWillNotProgress = true;
        isThisWillNotRegress = true;
        isNotInLoop = parentNotInLoop;
        isAtLeastOnce = parentAtLeastOnce;
        isNotSpeculative = parentNotSpeculative;
        isNotNegated = parentNotNegated;
    }